

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.h
# Opt level: O2

int dmrC_bb_terminated(basic_block *bb)

{
  byte *pbVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (bb != (basic_block *)0x0) {
    pbVar1 = (byte *)ptrlist_last((ptr_list *)bb->insns);
    if ((pbVar1 != (byte *)0x0) && (1 < *pbVar1)) {
      uVar2 = (uint)(*pbVar1 < 9);
    }
  }
  return uVar2;
}

Assistant:

static inline int dmrC_bb_terminated(struct basic_block *bb)
{
	struct instruction *insn;
	if (!bb)
		return 0;
	insn = dmrC_last_instruction(bb->insns);
	return insn && insn->opcode >= OP_TERMINATOR
	            && insn->opcode <= OP_TERMINATOR_END;
}